

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O1

size_t __thiscall llvm::StringRef::find(StringRef *this,StringRef Str,size_t From)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  char *pcVar8;
  ulong uVar9;
  ulong __n;
  size_t __n_00;
  char *__s2;
  size_t __n_01;
  char *__s1;
  size_t sVar10;
  size_t sVar11;
  uint8_t BadCharSkip [256];
  byte local_138 [264];
  
  __n = Str.Length;
  __s2 = Str.Data;
  sVar10 = 0xffffffffffffffff;
  __n_00 = this->Length - From;
  sVar11 = sVar10;
  if (((From <= this->Length) && (sVar11 = From, __n != 0)) && (sVar11 = sVar10, __n <= __n_00)) {
    pcVar3 = this->Data;
    __s1 = pcVar3 + From;
    if (__n == 1) {
      pvVar7 = memchr(__s1,(int)*__s2,__n_00);
      sVar11 = -(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)pcVar3;
    }
    else if (__n < 0x100 && 0xf < __n_00) {
      memset(local_138,(int)Str.Length,0x100);
      __n_01 = __n - 1;
      if (__n_01 != 0) {
        uVar6 = 1;
        uVar9 = 0;
        do {
          if (__n <= uVar9) {
            __assert_fail("Index < Length && \"Invalid index!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                          ,0xef,"char llvm::StringRef::operator[](size_t) const");
          }
          local_138[(byte)__s2[uVar9]] = (char)__n_01 - (char)uVar9;
          uVar9 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
        } while (__n_01 != uVar9);
      }
      pcVar8 = __s1 + (__n_00 - __n) + 1;
      bVar1 = __s2[__n_01];
      do {
        bVar2 = __s1[__n_01];
        if ((bVar2 == bVar1) && (iVar5 = bcmp(__s1,__s2,__n_01), iVar5 == 0)) {
          sVar10 = (long)__s1 - (long)pcVar3;
          bVar4 = false;
        }
        else {
          __s1 = __s1 + local_138[bVar2];
          bVar4 = true;
        }
        if (!bVar4) {
          return sVar10;
        }
      } while (__s1 < pcVar8);
      sVar11 = 0xffffffffffffffff;
    }
    else {
      do {
        iVar5 = bcmp(pcVar3 + From,__s2,__n);
        if (iVar5 == 0) {
          return From;
        }
        pcVar8 = pcVar3 + From;
        From = From + 1;
      } while (pcVar8 < __s1 + (__n_00 - __n));
    }
  }
  return sVar11;
}

Assistant:

size_t StringRef::find(StringRef Str, size_t From) const {
  if (From > Length)
    return npos;

  const char *Start = Data + From;
  size_t Size = Length - From;

  const char *Needle = Str.data();
  size_t N = Str.size();
  if (N == 0)
    return From;
  if (Size < N)
    return npos;
  if (N == 1) {
    const char *Ptr = (const char *)::memchr(Start, Needle[0], Size);
    return Ptr == nullptr ? npos : Ptr - Data;
  }

  const char *Stop = Start + (Size - N + 1);

  // For short haystacks or unsupported needles fall back to the naive algorithm
  if (Size < 16 || N > 255) {
    do {
      if (std::memcmp(Start, Needle, N) == 0)
        return Start - Data;
      ++Start;
    } while (Start < Stop);
    return npos;
  }

  // Build the bad char heuristic table, with uint8_t to reduce cache thrashing.
  uint8_t BadCharSkip[256];
  std::memset(BadCharSkip, N, 256);
  for (unsigned i = 0; i != N-1; ++i)
    BadCharSkip[(uint8_t)Str[i]] = N-1-i;

  do {
    uint8_t Last = Start[N - 1];
    if (LLVM_UNLIKELY(Last == (uint8_t)Needle[N - 1]))
      if (std::memcmp(Start, Needle, N - 1) == 0)
        return Start - Data;

    // Otherwise skip the appropriate number of bytes.
    Start += BadCharSkip[Last];
  } while (Start < Stop);

  return npos;
}